

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_vector.cpp
# Opt level: O3

string * __thiscall
duckdb::SelectionVector::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SelectionVector *this,idx_t count)

{
  bool bVar1;
  long lVar2;
  char cVar3;
  long *plVar4;
  uint *puVar5;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  idx_t iVar9;
  char cVar10;
  idx_t __val;
  string __str;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  SelectionVector *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  cVar10 = '\x01';
  if (9 < count) {
    iVar9 = count;
    cVar3 = '\x04';
    do {
      cVar10 = cVar3;
      if (iVar9 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_00dad89f;
      }
      if (iVar9 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_00dad89f;
      }
      if (iVar9 < 10000) goto LAB_00dad89f;
      bVar1 = 99999 < iVar9;
      iVar9 = iVar9 / 10000;
      cVar3 = cVar10 + '\x04';
    } while (bVar1);
    cVar10 = cVar10 + '\x01';
  }
LAB_00dad89f:
  local_60 = this;
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct((ulong)&local_50,cVar10);
  ::std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,count);
  plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1db57f7);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_70 = *plVar6;
    lStack_68 = plVar4[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar6;
    local_80 = (long *)*plVar4;
  }
  local_78 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_80);
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar7) {
    lVar2 = plVar4[3];
    local_58->_M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (count != 0) {
    iVar9 = 0;
    do {
      if (iVar9 == 0) {
        puVar5 = local_60->sel_vector;
        if (puVar5 != (uint *)0x0) goto LAB_00dad9df;
        cVar10 = '\x01';
        __val = 0;
      }
      else {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        __val = iVar9;
        if (local_60->sel_vector != (sel_t *)0x0) {
          puVar5 = local_60->sel_vector + iVar9;
LAB_00dad9df:
          __val = (idx_t)*puVar5;
        }
        cVar10 = '\x01';
        if (9 < __val) {
          uVar8 = __val;
          cVar3 = '\x04';
          do {
            cVar10 = cVar3;
            if (uVar8 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_00dada3c;
            }
            if (uVar8 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_00dada3c;
            }
            if (uVar8 < 10000) goto LAB_00dada3c;
            bVar1 = 99999 < uVar8;
            uVar8 = uVar8 / 10000;
            cVar3 = cVar10 + '\x04';
          } while (bVar1);
          cVar10 = cVar10 + '\x01';
        }
      }
LAB_00dada3c:
      local_80 = &local_70;
      ::std::__cxx11::string::_M_construct((ulong)&local_80,cVar10);
      ::std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_80,(uint)local_78,__val);
      ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_80);
      if (local_80 != &local_70) {
        operator_delete(local_80);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 != count);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string SelectionVector::ToString(idx_t count) const {
	string result = "Selection Vector (" + to_string(count) + ") [";
	for (idx_t i = 0; i < count; i++) {
		if (i != 0) {
			result += ", ";
		}
		result += to_string(get_index(i));
	}
	result += "]";
	return result;
}